

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool redit_trap(CHAR_DATA *ch,char *argument)

{
  ROOM_INDEX_DATA *pRVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  TRAP_DATA *pTVar6;
  char arg1 [4608];
  char local_1218 [4608];
  
  pRVar1 = ch->in_room;
  pcVar5 = one_argument(argument,local_1218);
  if ((pRVar1->trap == (TRAP_DATA *)0x0) || (local_1218[0] == '\0')) {
    if ((pRVar1->trap == (TRAP_DATA *)0x0) && (bVar2 = str_cmp(local_1218,"new"), !bVar2)) {
      pTVar6 = new_trap();
      pTVar6->room = pRVar1;
      pTVar6->type = 0;
      pTVar6->quality = 0;
      pTVar6->complexity = 0;
      pTVar6->trig_echo = (char *)0x0;
      pTVar6->exec_echo = (char *)0x0;
      *(undefined8 *)((long)&pTVar6->exec_echo + 5) = 0;
      pRVar1->trap = pTVar6;
      pcVar5 = "Trap created.\n\r";
      goto LAB_0036078a;
    }
    if (pRVar1->trap == (TRAP_DATA *)0x0) {
      pcVar5 = "Syntax:  trap new\n\r";
    }
    else {
      pcVar5 = 
      "Syntax:  trap type <type>\n\r              quality <#1-10>\n\r              complexity <#1-10>\n\r              timer <#1-10>\n\r              trigger <mesg>\n\r              execute <mesg>\n\r              delete\n\r"
      ;
    }
  }
  else {
    bVar2 = str_cmp(local_1218,"type");
    if (bVar2) {
      bVar2 = str_cmp(local_1218,"quality");
      if (bVar2) {
        bVar2 = str_cmp(local_1218,"complexity");
        if (bVar2) {
          bVar2 = str_cmp(local_1218,"timer");
          if (bVar2) {
            bVar2 = str_cmp(local_1218,"trigger");
            if (bVar2) {
              bVar2 = str_cmp(local_1218,"execute");
              if (bVar2) {
                bVar2 = str_cmp(local_1218,"delete");
                if (bVar2) {
                  redit_trap(ch,"");
                  return false;
                }
                free_trap(pRVar1->trap);
                pRVar1->trap = (TRAP_DATA *)0x0;
                pcVar5 = "Trap deleted.\n\r";
              }
              else {
                pcVar5 = palloc_string(pcVar5);
                pRVar1->trap->exec_echo = pcVar5;
                pcVar5 = "Execute echo updated.\n\r";
              }
            }
            else {
              pcVar5 = palloc_string(pcVar5);
              pRVar1->trap->trig_echo = pcVar5;
              pcVar5 = "Trigger echo updated.\n\r";
            }
          }
          else {
            uVar4 = atoi(pcVar5);
            if (0xf < uVar4) {
              pcVar5 = "Timer must be a number between 0 (immediate) and 15 seconds.\n\r";
              goto LAB_0036079d;
            }
            pRVar1->trap->timer = uVar4;
            pcVar5 = "Trap timer updated.\n\r";
          }
        }
        else {
          iVar3 = atoi(pcVar5);
          pRVar1->trap->complexity = iVar3;
          pcVar5 = "Trap complexity updated.\n\r";
        }
      }
      else {
        iVar3 = atoi(pcVar5);
        if (9 < iVar3 - 1U) {
          pcVar5 = "Quality must be a number between 1 and 10.\n\r";
          goto LAB_0036079d;
        }
        pRVar1->trap->quality = iVar3;
        pcVar5 = "Trap quality updated.\n\r";
      }
LAB_0036078a:
      send_to_char(pcVar5,ch);
      return true;
    }
    iVar3 = flag_lookup(pcVar5,trap_table);
    if (iVar3 == -99) {
      pcVar5 = "That is not a valid trap.\n\r";
    }
    else {
      pRVar1->trap->type = iVar3;
      pcVar5 = "Trap type updated.\n\r";
    }
  }
LAB_0036079d:
  send_to_char(pcVar5,ch);
  return false;
}

Assistant:

bool redit_trap(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;
	TRAP_DATA *trap;
	char arg1[MSL];
	int num;

	EDIT_ROOM(ch, pRoom);

	argument = one_argument(argument, arg1);

	if (pRoom->trap && arg1[0] != '\0')
	{
		if (!str_cmp(arg1, "type"))
		{
			num = flag_lookup(argument, trap_table);

			if (num == NO_FLAG)
			{
				send_to_char("That is not a valid trap.\n\r", ch);
				return false;
			}

			pRoom->trap->type = num;
			send_to_char("Trap type updated.\n\r", ch);
		}
		else if (!str_cmp(arg1, "quality"))
		{
			num = atoi(argument);

			if (num > 0 && num < 11)
			{
				pRoom->trap->quality = num;
				send_to_char("Trap quality updated.\n\r", ch);
				return true;
			}
			else
			{
				send_to_char("Quality must be a number between 1 and 10.\n\r", ch);
				return false;
			}
		}
		else if (!str_cmp(arg1, "complexity"))
		{
			num = atoi(argument);

			if (num > 0 || num < 101)
			{
				pRoom->trap->complexity = num;
				send_to_char("Trap complexity updated.\n\r", ch);
				return true;
			}
			else
			{
				send_to_char("Complexity must be a number between 1 and 100.\n\r", ch);
				return false;
			}
		}
		else if (!str_cmp(arg1, "timer"))
		{
			num = atoi(argument);

			if (num >= 0 && num < 16)
			{
				pRoom->trap->timer = num;
				send_to_char("Trap timer updated.\n\r", ch);
				return true;
			}
			else
			{
				send_to_char("Timer must be a number between 0 (immediate) and 15 seconds.\n\r", ch);
				return false;
			}
		}
		else if (!str_cmp(arg1, "trigger"))
		{
			pRoom->trap->trig_echo = palloc_string(argument);
			send_to_char("Trigger echo updated.\n\r", ch);
			return true;
		}
		else if (!str_cmp(arg1, "execute"))
		{
			pRoom->trap->exec_echo = palloc_string(argument);
			send_to_char("Execute echo updated.\n\r", ch);
			return true;
		}
		else if (!str_cmp(arg1, "delete"))
		{
			free_trap(pRoom->trap);
			pRoom->trap = nullptr;
			send_to_char("Trap deleted.\n\r", ch);
			return true;
		}
		else
		{
			redit_trap(ch, "");
			return false;
		}
	}
	else if (!pRoom->trap && !str_cmp(arg1, "new"))
	{
		trap = new_trap();
		trap->room = pRoom;
		trap->type = TRAP_NONE;
		trap->quality = 0;
		trap->complexity = 0;
		trap->timer = 0;
		trap->trig_echo = nullptr;
		trap->exec_echo = nullptr;
		trap->armed = false;
		pRoom->trap = trap;
		send_to_char("Trap created.\n\r", ch);
		return true;
	}
	else
	{
		if (pRoom->trap)
		{
			send_to_char("Syntax:  trap type <type>\n\r"\
						 "              quality <#1-10>\n\r"\
						 "              complexity <#1-10>\n\r"\
						 "              timer <#1-10>\n\r"\
						 "              trigger <mesg>\n\r"\
						 "              execute <mesg>\n\r"\
						 "              delete\n\r", ch);
		}
		else
			send_to_char("Syntax:  trap new\n\r", ch);

		return false;
	}

	return false;
}